

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_input_mouse_clicked(nk_input *i,nk_buttons id,nk_rect rect)

{
  float fVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  uVar2 = 0;
  if (i != (nk_input *)0x0) {
    fVar1 = (i->mouse).pos.x;
    fVar3 = rect.x;
    if ((fVar3 <= fVar1) && (fVar5 = fVar3 + rect.w, fVar1 < fVar5)) {
      fVar4 = rect.y;
      fVar1 = (i->mouse).pos.y;
      if ((fVar4 <= fVar1) && (fVar6 = fVar4 + rect.h, fVar1 < fVar6)) {
        fVar1 = (i->mouse).buttons[id].clicked_pos.x;
        if ((((fVar3 <= fVar1) && (fVar1 < fVar5)) &&
            (fVar1 = (i->mouse).buttons[id].clicked_pos.y, fVar4 <= fVar1)) &&
           ((fVar1 < fVar6 && ((i->mouse).buttons[id].down == 0)))) {
          uVar2 = (uint)((i->mouse).buttons[id].clicked != 0);
        }
      }
    }
  }
  return uVar2;
}

Assistant:

NK_API int
nk_input_mouse_clicked(const struct nk_input *i, enum nk_buttons id, struct nk_rect rect)
{
    if (!i) return nk_false;
    if (!nk_input_is_mouse_hovering_rect(i, rect)) return nk_false;
    return nk_input_is_mouse_click_in_rect(i, id, rect);
}